

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::binary_op_scalar<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
              (Mat *a,float b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  binary_op_add *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar4 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m128 afVar13;
  __m128 _p_2;
  __m128 _b;
  __m256 _p_1;
  __m256 _b_avx;
  __m512 _p;
  __m512 _b_avx512;
  int i;
  float *outptr;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_add op;
  Mat *m;
  Mat *m_1;
  __m256 *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  binary_op_add *this;
  __m512 *in_stack_fffffffffffffa20;
  __m512 *x;
  binary_op_add *this_00;
  float local_5a0 [2];
  float afStack_598 [2];
  float local_590 [4];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  int local_494;
  undefined8 local_490;
  float local_488 [6];
  long local_470;
  float local_468;
  float local_464;
  float local_460;
  float local_45c;
  float local_458;
  undefined8 local_450;
  float *local_448;
  undefined8 local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined4 local_418;
  long local_410;
  undefined4 local_408;
  undefined4 local_404;
  undefined4 local_400;
  undefined4 local_3fc;
  undefined4 local_3f8;
  undefined8 local_3f0;
  float *local_3e8;
  int local_3e0;
  int local_3dc;
  int local_3d8;
  binary_op_add local_3d1 [9];
  binary_op_add *local_3c8;
  float local_3bc;
  long *local_3b8;
  undefined1 local_3ad;
  int local_3ac;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_388;
  binary_op_add *local_378;
  undefined1 local_365;
  int local_364;
  undefined8 *local_358;
  undefined8 *local_348;
  undefined1 local_340 [64];
  float local_2cc;
  float *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  float *local_258;
  float local_24c;
  float *local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float *local_208;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float local_1ec;
  float *local_1e8;
  float local_1e0 [2];
  float afStack_1d8 [4];
  float *local_1c8;
  long local_1c0;
  undefined4 local_1b4;
  long local_1b0;
  float *local_1a8;
  undefined4 local_19c;
  int local_198;
  int local_194;
  __m512 *local_190;
  long local_188;
  undefined4 local_17c;
  long local_178;
  float *local_170;
  undefined4 local_164;
  int local_160;
  int local_15c;
  undefined8 *local_158;
  undefined4 local_14c;
  long local_148;
  undefined4 local_13c;
  long local_138;
  binary_op_add *local_108;
  undefined8 *local_e8;
  undefined1 local_a0 [32];
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  
  local_3d8 = (int)in_RDI[7];
  local_3dc = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_3c8 = in_RSI;
  local_3bc = in_XMM0_Da;
  local_3b8 = in_RDI;
  for (local_3e0 = 0; local_3e0 < local_3d8; local_3e0 = local_3e0 + 1) {
    local_3a0 = &local_430;
    local_15c = *(int *)((long)local_3b8 + 0x2c);
    local_160 = (int)local_3b8[6];
    local_164 = *(undefined4 *)((long)local_3b8 + 0x34);
    local_3e8 = (float *)(*local_3b8 + local_3b8[8] * (long)local_3e0 * local_3b8[2]);
    local_178 = local_3b8[2];
    local_17c = (undefined4)local_3b8[3];
    local_188 = local_3b8[4];
    local_158 = &local_430;
    local_148 = (long)local_15c * (long)local_160 * local_178;
    local_398 = &local_430;
    local_388 = &local_430;
    local_358 = &local_490;
    local_194 = *(int *)(local_3c8 + 0x2c);
    local_198 = *(int *)(local_3c8 + 0x30);
    local_19c = *(undefined4 *)(local_3c8 + 0x34);
    local_448 = (float *)(*(long *)local_3c8 +
                         *(long *)(local_3c8 + 0x40) * (long)local_3e0 * *(long *)(local_3c8 + 0x10)
                         );
    local_1b0 = *(long *)(local_3c8 + 0x10);
    local_1b4 = *(undefined4 *)(local_3c8 + 0x18);
    local_1c0 = *(long *)(local_3c8 + 0x20);
    x = (__m512 *)&local_490;
    local_138 = (long)local_194 * (long)local_198 * local_1b0;
    local_348 = &local_490;
    this = (binary_op_add *)&local_490;
    local_3f8 = 0;
    local_3fc = 0;
    local_400 = 0;
    local_404 = 0;
    local_418 = 0;
    local_420 = 0;
    local_428 = 0;
    local_430 = 0;
    local_13c = 0x10;
    local_14c = 0x10;
    local_364 = local_3e0;
    local_365 = 1;
    local_3ac = local_3e0;
    local_3ad = 1;
    local_3f0 = 0;
    local_408 = 0;
    local_490._0_4_ = 0.0;
    local_490._4_4_ = 0.0;
    local_488[2] = 0.0;
    local_488[3] = 0.0;
    local_488[4] = 0.0;
    local_468 = 0.0;
    local_464 = 0.0;
    local_460 = 0.0;
    local_45c = 0.0;
    local_458 = 0.0;
    local_450 = 0;
    local_488[0] = 0.0;
    local_488[1] = 0.0;
    local_494 = 0;
    local_2cc = local_3bc;
    local_340 = vbroadcastss_avx512f(ZEXT416((uint)local_3bc));
    local_500 = local_340._0_8_;
    uStack_4f8 = local_340._8_8_;
    uStack_4f0 = local_340._16_8_;
    uStack_4e8 = local_340._24_8_;
    uStack_4e0 = local_340._32_8_;
    uStack_4d8 = local_340._40_8_;
    uStack_4d0 = local_340._48_8_;
    uStack_4c8 = local_340._56_8_;
    this_00 = local_3c8;
    local_378 = this;
    local_1a8 = local_448;
    local_190 = x;
    local_170 = local_3e8;
    local_108 = this;
    local_e8 = local_388;
    local_470 = local_1c0;
    local_410 = local_188;
    for (; local_494 + 0xf < local_3dc; local_494 = local_494 + 0x10) {
      local_2c8 = local_3e8;
      uVar6 = *(undefined8 *)local_3e8;
      uVar5 = *(undefined8 *)(local_3e8 + 2);
      uVar7 = *(undefined8 *)(local_3e8 + 4);
      uVar8 = *(undefined8 *)(local_3e8 + 6);
      uVar9 = *(undefined8 *)(local_3e8 + 8);
      uVar10 = *(undefined8 *)(local_3e8 + 10);
      uVar11 = *(undefined8 *)(local_3e8 + 0xc);
      uVar12 = *(undefined8 *)(local_3e8 + 0xe);
      local_540 = uVar6;
      uStack_538 = uVar5;
      uStack_530 = uVar7;
      uStack_528 = uVar8;
      uStack_520 = uVar9;
      uStack_518 = uVar10;
      uStack_510 = uVar11;
      uStack_508 = uVar12;
      BinaryOp_x86_avx512_functor::binary_op_add::func_pack16(this_00,x,in_stack_fffffffffffffa20);
      local_258 = local_448;
      *(undefined8 *)local_448 = uVar6;
      *(undefined8 *)(local_448 + 2) = uVar5;
      *(undefined8 *)(local_448 + 4) = uVar7;
      *(undefined8 *)(local_448 + 6) = uVar8;
      *(undefined8 *)(local_448 + 8) = uVar9;
      *(undefined8 *)(local_448 + 10) = uVar10;
      *(undefined8 *)(local_448 + 0xc) = uVar11;
      *(undefined8 *)(local_448 + 0xe) = uVar12;
      local_3e8 = local_3e8 + 0x10;
      local_448 = local_448 + 0x10;
      local_540 = uVar6;
      uStack_538 = uVar5;
      uStack_530 = uVar7;
      uStack_528 = uVar8;
      uStack_520 = uVar9;
      uStack_518 = uVar10;
      uStack_510 = uVar11;
      uStack_508 = uVar12;
      local_2c0 = uVar6;
      uStack_2b8 = uVar5;
      uStack_2b0 = uVar7;
      uStack_2a8 = uVar8;
      uStack_2a0 = uVar9;
      uStack_298 = uVar10;
      uStack_290 = uVar11;
      uStack_288 = uVar12;
    }
    local_24c = local_3bc;
    local_54 = local_3bc;
    local_58 = local_3bc;
    local_5c = local_3bc;
    local_60 = local_3bc;
    local_64 = local_3bc;
    local_68 = local_3bc;
    local_6c = local_3bc;
    local_70 = local_3bc;
    auVar1 = vinsertps_avx(ZEXT416((uint)local_3bc),ZEXT416((uint)local_3bc),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_3bc),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_3bc),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)local_3bc),ZEXT416((uint)local_3bc),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_3bc),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_3bc),0x30);
    auVar4._16_16_ = auVar1;
    auVar4._0_16_ = auVar2;
    local_a0._0_8_ = auVar2._0_8_;
    local_a0._8_8_ = auVar2._8_8_;
    local_a0._16_8_ = auVar1._0_8_;
    local_a0._24_8_ = auVar1._8_8_;
    local_560 = local_a0._0_8_;
    uStack_558 = local_a0._8_8_;
    uStack_550 = local_a0._16_8_;
    uStack_548 = local_a0._24_8_;
    fVar3 = local_3bc;
    local_a0 = auVar4;
    for (; local_494 + 7 < local_3dc; local_494 = local_494 + 8) {
      local_248 = local_3e8;
      uVar6 = *(undefined8 *)local_3e8;
      uVar5 = *(undefined8 *)(local_3e8 + 2);
      uVar7 = *(undefined8 *)(local_3e8 + 4);
      uVar8 = *(undefined8 *)(local_3e8 + 6);
      local_580 = uVar6;
      uStack_578 = uVar5;
      uStack_570 = uVar7;
      uStack_568 = uVar8;
      BinaryOp_x86_avx512_functor::binary_op_add::func_pack8
                (this,(__m256 *)CONCAT44(fVar3,in_stack_fffffffffffffa08),in_stack_fffffffffffffa00)
      ;
      local_208 = local_448;
      *(undefined8 *)local_448 = uVar6;
      *(undefined8 *)(local_448 + 2) = uVar5;
      *(undefined8 *)(local_448 + 4) = uVar7;
      *(undefined8 *)(local_448 + 6) = uVar8;
      local_3e8 = local_3e8 + 8;
      local_448 = local_448 + 8;
      local_580 = uVar6;
      uStack_578 = uVar5;
      uStack_570 = uVar7;
      uStack_568 = uVar8;
      local_240 = uVar6;
      uStack_238 = uVar5;
      uStack_230 = uVar7;
      uStack_228 = uVar8;
    }
    local_1ec = local_3bc;
    local_200 = local_3bc;
    fStack_1fc = local_3bc;
    fStack_1f8 = local_3bc;
    fStack_1f4 = local_3bc;
    for (; local_494 + 3 < local_3dc; local_494 = local_494 + 4) {
      local_1e8 = local_3e8;
      local_5a0 = *(float (*) [2])local_3e8;
      uVar6 = *(undefined8 *)(local_3e8 + 2);
      afStack_598 = (float  [2])uVar6;
      afVar13 = BinaryOp_x86_avx512_functor::binary_op_add::func_pack4
                          (local_3d1,(__m128 *)local_5a0,&local_590);
      local_5a0 = afVar13._0_8_;
      local_1c8 = local_448;
      *(float (*) [2])local_448 = local_5a0;
      *(undefined8 *)(local_448 + 2) = uVar6;
      local_3e8 = local_3e8 + 4;
      local_448 = local_448 + 4;
      afStack_598 = (float  [2])uVar6;
      local_1e0 = local_5a0;
      afStack_1d8._0_8_ = uVar6;
    }
    for (; local_494 < local_3dc; local_494 = local_494 + 1) {
      fVar3 = BinaryOp_x86_avx512_functor::binary_op_add::func(local_3d1,local_3e8,&local_3bc);
      *local_448 = fVar3;
      local_3e8 = local_3e8 + 1;
      local_448 = local_448 + 1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar(const Mat& a, float b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b_avx512 = _mm512_set1_ps(b);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p, _b_avx512);
            _mm512_storeu_ps(outptr, _p);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b_avx = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p, _b_avx);
            _mm256_storeu_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b = _mm_set1_ps(b);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p, _b);
            _mm_store_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b);
            ptr++;
            outptr++;
        }
    }

    return 0;
}